

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Scene::Scene
          (Scene *this,
          vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
          *_objects,
          vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
          *_lights)

{
  size_type sVar1;
  reference ppSVar2;
  XFormWidget *this_00;
  XFormWidget *pXVar3;
  vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
  *in_RDX;
  vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *in_RSI;
  Scene *in_RDI;
  pair<std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneLight_*>,_bool> pVar4;
  int i_1;
  int i;
  Selection *in_stack_ffffffffffffff30;
  _Rb_tree_const_iterator<CMU462::DynamicScene::SceneLight_*> in_stack_ffffffffffffff48;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *in_stack_ffffffffffffff50;
  int local_44;
  int local_1c;
  
  Selection::Selection(in_stack_ffffffffffffff30);
  Selection::Selection(in_stack_ffffffffffffff30);
  Selection::Selection(in_stack_ffffffffffffff30);
  std::
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  ::set((set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
         *)0x20c0ad);
  std::
  set<CMU462::DynamicScene::SceneLight_*,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
  ::set((set<CMU462::DynamicScene::SceneLight_*,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
         *)0x20c0c3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x20c0d9);
  local_1c = 0;
  while( true ) {
    sVar1 = std::
            vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
            ::size(in_RSI);
    if (sVar1 <= (ulong)(long)local_1c) break;
    ppSVar2 = std::
              vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
              ::operator[](in_RSI,(long)local_1c);
    (*ppSVar2)->scene = in_RDI;
    std::
    vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
    ::operator[](in_RSI,(long)local_1c);
    std::
    set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
    ::insert(in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48._M_node);
    local_1c = local_1c + 1;
  }
  local_44 = 0;
  while( true ) {
    this_00 = (XFormWidget *)(long)local_44;
    pXVar3 = (XFormWidget *)
             std::
             vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
             ::size(in_RDX);
    if (pXVar3 <= this_00) break;
    std::
    vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
    ::operator[](in_RDX,(long)local_44);
    pVar4 = std::
            set<CMU462::DynamicScene::SceneLight_*,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
            ::insert((set<CMU462::DynamicScene::SceneLight_*,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
                      *)this_00,(value_type *)in_stack_ffffffffffffff48._M_node);
    in_stack_ffffffffffffff48 = pVar4.first._M_node;
    local_44 = local_44 + 1;
  }
  pXVar3 = (XFormWidget *)operator_new(0x218);
  XFormWidget::XFormWidget(this_00);
  in_RDI->elementTransform = pXVar3;
  return;
}

Assistant:

Scene::Scene(std::vector<SceneObject *> _objects,
             std::vector<SceneLight *> _lights) {
  for (int i = 0; i < _objects.size(); i++) {
    _objects[i]->scene = this;
    objects.insert(_objects[i]);
  }

  for (int i = 0; i < _lights.size(); i++) {
    lights.insert(_lights[i]);
  }

  elementTransform = new XFormWidget();
}